

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_improved_flip(integral_image *iimage,interest_point *ipoint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int s;
  int col;
  int iVar10;
  int row;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_register_00001384 [12];
  float local_e4;
  float local_e0;
  int local_d8;
  long local_d0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  float local_78;
  float local_68;
  undefined1 extraout_var [60];
  
  fVar19 = ipoint->scale;
  auVar20._8_4_ = 0x80000000;
  auVar20._0_8_ = 0x8000000080000000;
  auVar20._12_4_ = 0x80000000;
  auVar13._8_4_ = 0x3effffff;
  auVar13._0_8_ = 0x3effffff3effffff;
  auVar13._12_4_ = 0x3effffff;
  auVar11 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)fVar19),auVar20,0xf8);
  auVar12 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)ipoint->y),auVar20,0xf8);
  auVar11 = ZEXT416((uint)(fVar19 + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  s = (int)(auVar11._0_4_ + auVar11._0_4_);
  auVar11 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)ipoint->x),auVar20,0xf8);
  auVar15._0_8_ = (double)fVar19;
  auVar15._8_8_ = 0;
  auVar11 = ZEXT416((uint)(ipoint->x + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  auVar14._0_8_ = (double)auVar11._0_4_;
  auVar14._8_8_ = auVar11._8_8_;
  auVar20 = vfmadd231sd_fma(auVar14,auVar15,ZEXT816(0x3fe0000000000000));
  auVar11 = ZEXT416((uint)(ipoint->y + auVar12._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  auVar12._0_8_ = (double)auVar11._0_4_;
  auVar12._8_8_ = auVar11._8_8_;
  auVar11 = vfmadd231sd_fma(auVar12,auVar15,ZEXT816(0x3fe0000000000000));
  auVar29 = ZEXT864(0) << 0x20;
  iVar10 = 0;
  local_e4 = -2.5;
  local_d0 = 0;
  for (iVar6 = -8; iVar6 < 8; iVar6 = iVar6 + 5) {
    auVar37._0_4_ = (float)iVar6;
    auVar37._4_12_ = in_register_00001384;
    local_e4 = local_e4 + 1.0;
    local_d0 = (long)(int)local_d0;
    auVar12 = vfmadd132ss_fma(auVar37,ZEXT416((uint)(float)auVar20._0_8_),ZEXT416((uint)fVar19));
    auVar31._8_4_ = 0x3effffff;
    auVar31._0_8_ = 0x3effffff3effffff;
    auVar31._12_4_ = 0x3effffff;
    auVar16._8_4_ = 0x80000000;
    auVar16._0_8_ = 0x8000000080000000;
    auVar16._12_4_ = 0x80000000;
    auVar13 = vpternlogd_avx512vl(auVar31,auVar12,auVar16,0xf8);
    auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
    auVar12 = vroundss_avx(auVar12,auVar12,0xb);
    auVar32._0_4_ = (int)auVar12._0_4_;
    auVar32._4_4_ = (int)auVar12._4_4_;
    auVar32._8_4_ = (int)auVar12._8_4_;
    auVar32._12_4_ = (int)auVar12._12_4_;
    auVar12 = vcvtdq2ps_avx(auVar32);
    local_d8 = -3;
    iVar9 = -8;
    local_e0 = -2.5;
    while (iVar9 < 8) {
      auVar21._0_4_ = (float)iVar9;
      auVar21._4_12_ = in_register_00001384;
      iVar5 = iVar9 + -4;
      auVar13 = vfmadd132ss_fma(auVar21,ZEXT416((uint)(float)auVar11._0_8_),ZEXT416((uint)fVar19));
      auVar33._8_4_ = 0x3effffff;
      auVar33._0_8_ = 0x3effffff3effffff;
      auVar33._12_4_ = 0x3effffff;
      auVar1._8_4_ = 0x80000000;
      auVar1._0_8_ = 0x8000000080000000;
      auVar1._12_4_ = 0x80000000;
      auVar14 = vpternlogd_avx512vl(auVar33,auVar13,auVar1,0xf8);
      auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar14._0_4_));
      auVar13 = vroundss_avx(auVar13,auVar13,0xb);
      auVar22._0_4_ = (int)auVar13._0_4_;
      auVar22._4_4_ = (int)auVar13._4_4_;
      auVar22._8_4_ = (int)auVar13._8_4_;
      auVar22._12_4_ = (int)auVar13._12_4_;
      auVar13 = vcvtdq2ps_avx(auVar22);
      _local_98 = ZEXT816(0) << 0x20;
      for (; iVar5 != local_d8; iVar5 = iVar5 + 1) {
        auVar23._0_4_ = (float)iVar5;
        auVar23._4_12_ = in_register_00001384;
        auVar14 = vfmadd132ss_fma(auVar23,ZEXT416((uint)(float)auVar11._0_8_),ZEXT416((uint)fVar19))
        ;
        auVar34._8_4_ = 0x3effffff;
        auVar34._0_8_ = 0x3effffff3effffff;
        auVar34._12_4_ = 0x3effffff;
        auVar2._8_4_ = 0x80000000;
        auVar2._0_8_ = 0x8000000080000000;
        auVar2._12_4_ = 0x80000000;
        auVar15 = vpternlogd_avx512vl(auVar34,auVar14,auVar2,0xf8);
        local_78 = auVar13._0_4_;
        auVar14 = ZEXT416((uint)(auVar14._0_4_ + auVar15._0_4_));
        auVar14 = vroundss_avx(auVar14,auVar14,0xb);
        row = (int)auVar14._0_4_;
        auVar24._0_4_ = (int)auVar14._0_4_;
        auVar24._4_4_ = (int)auVar14._4_4_;
        auVar24._8_4_ = (int)auVar14._8_4_;
        auVar24._12_4_ = (int)auVar14._12_4_;
        auVar14 = vcvtdq2ps_avx(auVar24);
        iVar8 = -0xc;
        while (iVar8 != -3) {
          auVar25._0_4_ = (float)(iVar10 + iVar8);
          auVar25._4_12_ = in_register_00001384;
          auVar15 = vfmadd132ss_fma(auVar25,ZEXT416((uint)(float)auVar20._0_8_),
                                    ZEXT416((uint)fVar19));
          auVar35._8_4_ = 0x3effffff;
          auVar35._0_8_ = 0x3effffff3effffff;
          auVar35._12_4_ = 0x3effffff;
          auVar3._8_4_ = 0x80000000;
          auVar3._0_8_ = 0x8000000080000000;
          auVar3._12_4_ = 0x80000000;
          auVar16 = vpternlogd_avx512vl(auVar35,auVar15,auVar3,0xf8);
          local_68 = auVar12._0_4_;
          auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar16._0_4_));
          auVar15 = vroundss_avx(auVar15,auVar15,0xb);
          col = (int)auVar15._0_4_;
          auVar26._0_4_ = (int)auVar15._0_4_;
          auVar26._4_4_ = (int)auVar15._4_4_;
          auVar26._8_4_ = (int)auVar15._8_4_;
          auVar26._12_4_ = (int)auVar15._12_4_;
          auVar15 = vcvtdq2ps_avx(auVar26);
          fVar17 = gaussianf(local_68 - auVar15._0_4_,local_78 - auVar14._0_4_,fVar19 * 2.5);
          fVar18 = haarX_improved(iimage,row,col,s);
          auVar30._0_4_ = haarY_improved(iimage,row,col,s);
          auVar30._4_60_ = extraout_var;
          auVar15 = vinsertps_avx(auVar30._0_16_,ZEXT416((uint)fVar18),0x10);
          iVar8 = iVar8 + 1;
          auVar27._0_4_ = fVar17 * auVar15._0_4_;
          auVar27._4_4_ = fVar17 * auVar15._4_4_;
          auVar27._8_4_ = fVar17 * auVar15._8_4_;
          auVar27._12_4_ = fVar17 * auVar15._12_4_;
          auVar4._8_4_ = 0x7fffffff;
          auVar4._0_8_ = 0x7fffffff7fffffff;
          auVar4._12_4_ = 0x7fffffff;
          auVar15 = vandps_avx512vl(auVar27,auVar4);
          auVar15 = vmovlhps_avx(auVar27,auVar15);
          local_98._4_4_ = (float)local_98._4_4_ + auVar15._4_4_;
          local_98._0_4_ = (float)local_98._0_4_ + auVar15._0_4_;
          fStack_90 = fStack_90 + auVar15._8_4_;
          fStack_8c = fStack_8c + auVar15._12_4_;
        }
      }
      iVar9 = iVar9 + 5;
      local_e0 = local_e0 + 1.0;
      fVar17 = gaussianf(local_e4,local_e0,1.5);
      auVar28._0_4_ = fVar17 * (float)local_98._0_4_;
      auVar28._4_4_ = fVar17 * (float)local_98._4_4_;
      auVar28._8_4_ = fVar17 * fStack_90;
      auVar28._12_4_ = fVar17 * fStack_8c;
      local_d8 = local_d8 + 5;
      auVar36._0_4_ = auVar28._0_4_ * auVar28._0_4_;
      auVar36._4_4_ = auVar28._4_4_ * auVar28._4_4_;
      auVar36._8_4_ = auVar28._8_4_ * auVar28._8_4_;
      auVar36._12_4_ = auVar28._12_4_ * auVar28._12_4_;
      auVar14 = vshufpd_avx(auVar28,auVar28,1);
      *(undefined1 (*) [16])(ipoint->descriptor + local_d0) = auVar28;
      local_d0 = local_d0 + 4;
      auVar13 = vmovshdup_avx(auVar36);
      auVar13 = vfmadd231ss_fma(auVar13,auVar28,auVar28);
      auVar14 = vfmadd213ss_fma(auVar14,auVar14,auVar13);
      auVar13 = vshufps_avx(auVar28,auVar28,0xff);
      auVar13 = vfmadd213ss_fma(auVar13,auVar13,auVar14);
      auVar29 = ZEXT464((uint)(auVar29._0_4_ + auVar13._0_4_));
    }
    iVar10 = iVar10 + 5;
  }
  if (auVar29._0_4_ < 0.0) {
    fVar19 = sqrtf(auVar29._0_4_);
  }
  else {
    auVar11 = vsqrtss_avx(auVar29._0_16_,auVar29._0_16_);
    fVar19 = auVar11._0_4_;
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    ipoint->descriptor[lVar7] = (1.0 / fVar19) * ipoint->descriptor[lVar7];
  }
  return;
}

Assistant:

void get_msurf_descriptor_improved_flip(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - same as get_msurf_descriptor_improved
        - switched order of inner loops to go along x direction for better locality
    */

    float scale = ipoint->scale;
    float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;

                    //Get the gaussian weighted x and y responses
                    // TODO: (Sebastian) Precompute this...
                    float gauss_s1 = gaussianf(xs_sub_sample_x, ys_sub_sample_y, scale_mul_25f);
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            float gauss_s2 = gaussianf(cx, cy, 1.5f);

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}